

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglCreateSurfaceTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::anon_unknown_5::CreateWindowSurfaceCase::executeForConfig
          (CreateWindowSurfaceCase *this,EGLDisplay display,EGLConfig config)

{
  WindowParams *this_00;
  NativeWindowFactory *pNVar1;
  TestLog *pTVar2;
  Library *pLVar3;
  EGLConfig pvVar4;
  Capability CVar5;
  deUint32 dVar6;
  Visibility visibility_;
  int iVar7;
  deBool dVar8;
  NativeDisplayFactory *factory;
  CommandLine *pCVar9;
  NotSupportedError *pNVar10;
  MessageBuilder *pMVar11;
  NativeDisplay *pNVar12;
  NativeWindow *window_00;
  EGLSurface pvVar13;
  MessageBuilder local_518;
  MessageBuilder local_398;
  int local_218;
  int local_214;
  EGLint windowHeight;
  EGLint windowWidth;
  UniqueSurface surface;
  undefined1 local_1e8 [8];
  UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> window;
  int height;
  int width;
  NativeWindowFactory *local_40;
  NativeWindowFactory *windowFactory;
  TestLog *pTStack_30;
  EGLint id;
  TestLog *log;
  Library *egl;
  EGLConfig config_local;
  EGLDisplay display_local;
  CreateWindowSurfaceCase *this_local;
  
  egl = (Library *)config;
  config_local = display;
  display_local = this;
  log = (TestLog *)
        EglTestContext::getLibrary((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pTStack_30 = tcu::TestContext::getLog
                         ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.
                          super_TestNode.m_testCtx);
  windowFactory._4_4_ = eglu::getConfigID((Library *)log,config_local,egl);
  factory = EglTestContext::getNativeDisplayFactory
                      ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pCVar9 = tcu::TestContext::getCommandLine
                     ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  local_40 = eglu::selectNativeWindowFactory(factory,pCVar9);
  if ((this->m_useLegacyCreate & 1U) == 0) {
    CVar5 = eglu::NativeWindowFactory::getCapabilities(local_40);
    if ((CVar5 & CAPABILITY_CREATE_SURFACE_PLATFORM) == 0) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar10,"Native window doesn\'t support eglCreatePlatformWindowSurfaceEXT()",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                 ,0x85);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  else {
    CVar5 = eglu::NativeWindowFactory::getCapabilities(local_40);
    if ((CVar5 & CAPABILITY_CREATE_SURFACE_LEGACY) == 0) {
      pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar10,"Native window doesn\'t support legacy eglCreateWindowSurface()",
                 (char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                 ,0x80);
      __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  tcu::TestLog::operator<<
            ((MessageBuilder *)&height,pTStack_30,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar11 = tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)&height,
                       (char (*) [40])"Creating window surface with config ID ");
  pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(int *)((long)&windowFactory + 4));
  tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&height);
  dVar6 = (*(code *)log->m_log[6].lock)();
  eglu::checkError(dVar6,"init",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                   ,0x89);
  pNVar1 = local_40;
  window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data._12_4_
       = 0x40;
  window.super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data._8_4_
       = 0x40;
  pNVar12 = EglTestContext::getNativeDisplay
                      ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  pvVar4 = config_local;
  pLVar3 = egl;
  pCVar9 = tcu::TestContext::getCommandLine
                     ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.
                      m_testCtx);
  visibility_ = eglu::parseWindowVisibility(pCVar9);
  this_00 = (WindowParams *)((long)&surface.m_surface + 4);
  eglu::WindowParams::WindowParams(this_00,0x40,0x40,visibility_);
  iVar7 = (*(pNVar1->super_FactoryBase).super_AbstractFactory._vptr_AbstractFactory[4])
                    (pNVar1,pNVar12,pvVar4,pLVar3,0,this_00);
  de::DefaultDeleter<eglu::NativeWindow>::DefaultDeleter
            ((DefaultDeleter<eglu::NativeWindow> *)((long)&surface.m_surface + 3));
  de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::UniquePtr
            ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_1e8,
             iVar7);
  pvVar4 = config_local;
  pLVar3 = egl;
  pTVar2 = log;
  pNVar12 = EglTestContext::getNativeDisplay
                      ((this->super_SimpleConfigCase).super_TestCase.m_eglTestCtx);
  window_00 = de::details::UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::
              operator*((UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)
                        local_1e8);
  pvVar13 = createWindowSurface(pvVar4,pLVar3,pNVar12,window_00,(bool)(this->m_useLegacyCreate & 1))
  ;
  eglu::UniqueSurface::UniqueSurface
            ((UniqueSurface *)&windowHeight,(Library *)pTVar2,pvVar4,pvVar13);
  local_214 = 0;
  local_218 = 0;
  do {
    pvVar4 = config_local;
    pTVar2 = log;
    pvVar13 = eglu::UniqueSurface::operator*((UniqueSurface *)&windowHeight);
    (*(code *)pTVar2->m_log[8].writer)(pTVar2,pvVar4,pvVar13,0x3057,&local_214);
    dVar6 = (*(code *)log->m_log[6].lock)();
    eglu::checkError(dVar6,"querySurface(display, *surface, EGL_WIDTH, &windowWidth)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                     ,0x94);
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  do {
    pvVar4 = config_local;
    pTVar2 = log;
    pvVar13 = eglu::UniqueSurface::operator*((UniqueSurface *)&windowHeight);
    (*(code *)pTVar2->m_log[8].writer)(pTVar2,pvVar4,pvVar13,0x3056,&local_218);
    dVar6 = (*(code *)log->m_log[6].lock)();
    eglu::checkError(dVar6,"querySurface(display, *surface, EGL_HEIGHT, &windowHeight)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglCreateSurfaceTests.cpp"
                     ,0x95);
    dVar8 = ::deGetFalse();
  } while (dVar8 != 0);
  if ((local_214 < 1) || (local_218 < 1)) {
    tcu::TestLog::operator<<(&local_398,pTStack_30,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_398,(char (*) [30])0x2b59a9f);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_214);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,(char (*) [2])0x2a9098a);
    pMVar11 = tcu::MessageBuilder::operator<<(pMVar11,&local_218);
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_398);
    tcu::TestContext::setTestResult
              ((this->super_SimpleConfigCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx
               ,QP_TEST_RESULT_FAIL,"Invalid surface size");
  }
  else {
    tcu::TestLog::operator<<(&local_518,pTStack_30,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar11 = tcu::MessageBuilder::operator<<(&local_518,(char (*) [7])"  Pass");
    tcu::MessageBuilder::operator<<(pMVar11,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_518);
  }
  eglu::UniqueSurface::~UniqueSurface((UniqueSurface *)&windowHeight);
  de::details::UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>::~UniquePtr
            ((UniquePtr<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_> *)local_1e8);
  return;
}

Assistant:

void executeForConfig (EGLDisplay display, EGLConfig config)
	{
		const Library&						egl				= m_eglTestCtx.getLibrary();
		TestLog&							log				= m_testCtx.getLog();
		EGLint								id				= eglu::getConfigID(egl, display, config);
		const eglu::NativeWindowFactory&	windowFactory	= eglu::selectNativeWindowFactory(m_eglTestCtx.getNativeDisplayFactory(), m_testCtx.getCommandLine());

		// \todo [2011-03-23 pyry] Iterate thru all possible combinations of EGL_RENDER_BUFFER, EGL_VG_COLORSPACE and EGL_VG_ALPHA_FORMAT

		if (m_useLegacyCreate)
		{
			if ((windowFactory.getCapabilities() & eglu::NativeWindow::CAPABILITY_CREATE_SURFACE_LEGACY) == 0)
				TCU_THROW(NotSupportedError, "Native window doesn't support legacy eglCreateWindowSurface()");
		}
		else
		{
			if ((windowFactory.getCapabilities() & eglu::NativeWindow::CAPABILITY_CREATE_SURFACE_PLATFORM) == 0)
				TCU_THROW(NotSupportedError, "Native window doesn't support eglCreatePlatformWindowSurfaceEXT()");
		}

		log << TestLog::Message << "Creating window surface with config ID " << id << TestLog::EndMessage;
		EGLU_CHECK_MSG(egl, "init");

		{
			const int							width			= 64;
			const int							height			= 64;
			de::UniquePtr<eglu::NativeWindow>	window			(windowFactory.createWindow(&m_eglTestCtx.getNativeDisplay(), display, config, DE_NULL, eglu::WindowParams(width, height, eglu::parseWindowVisibility(m_testCtx.getCommandLine()))));
			eglu::UniqueSurface					surface			(egl, display, createWindowSurface(display, config, m_eglTestCtx.getNativeDisplay(), *window, m_useLegacyCreate));

			EGLint								windowWidth		= 0;
			EGLint								windowHeight	= 0;

			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_WIDTH,		&windowWidth));
			EGLU_CHECK_CALL(egl, querySurface(display, *surface, EGL_HEIGHT,	&windowHeight));

			if (windowWidth <= 0 || windowHeight <= 0)
			{
				log << TestLog::Message << "  Fail, invalid surface size " << windowWidth << "x" << windowHeight << TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid surface size");
			}
			else
				log << TestLog::Message << "  Pass" << TestLog::EndMessage;
		}
	}